

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void nn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  __node_base *p_Var1;
  undefined1 auVar2 [16];
  int iVar3;
  pointer pbVar4;
  __buckets_ptr __nptr;
  pointer pcVar5;
  undefined8 uVar6;
  int iVar7;
  int *piVar8;
  istream *piVar9;
  long lVar10;
  string prompt;
  string queryWord;
  FastText fasttext;
  char *local_450;
  long local_448;
  char local_440 [16];
  string local_430;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  FastText local_3f8;
  Args local_370;
  Args local_1d0;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5;
  if (lVar10 != 3) {
    if (lVar10 != 4) {
      printNNUsage();
      exit(1);
    }
    __nptr = (__buckets_ptr)pbVar4[3]._M_dataplus._M_p;
    piVar8 = __errno_location();
    iVar3 = *piVar8;
    *piVar8 = 0;
    lVar10 = strtol((char *)__nptr,(char **)&local_370,10);
    if (local_370.manualArgs_._M_h._M_buckets != __nptr) {
      iVar7 = *piVar8;
      if ((int)lVar10 != lVar10 || iVar7 == 0x22) {
        iVar7 = std::__throw_out_of_range("stoi");
      }
      if (iVar7 == 0) {
        *piVar8 = iVar3;
      }
      goto LAB_0011b803;
    }
    std::__throw_invalid_argument("stoi");
  }
  lVar10 = 10;
LAB_0011b803:
  ::fasttext::FastText::FastText(&local_3f8);
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = &local_370.manualArgs_._M_h._M_before_begin;
  pcVar5 = pbVar4[2]._M_dataplus._M_p;
  local_370.manualArgs_._M_h._M_buckets = &p_Var1->_M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,pcVar5,pcVar5 + pbVar4[2]._M_string_length);
  ::fasttext::FastText::loadModel(&local_3f8,(string *)&local_370);
  if ((__node_base *)local_370.manualArgs_._M_h._M_buckets != p_Var1) {
    operator_delete(local_370.manualArgs_._M_h._M_buckets);
  }
  local_450 = local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Query word? ","");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_450,local_448);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar9 = std::operator>>((istream *)&std::cin,(string *)&local_430);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
    ::fasttext::FastText::getArgs(&local_370,&local_3f8);
    iVar3 = local_370.factor;
    ::fasttext::FastText::getArgs(&local_1d0,&local_3f8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_1d0.addWo;
    uVar6 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar2,4);
    ::fasttext::FastText::getNNMod
              (&local_410,&local_3f8,&local_430,(int32_t)lVar10,iVar3,(bool)((byte)uVar6 & 1));
    printPredictions(&local_410,true,true);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_410);
    ::fasttext::Args::~Args(&local_1d0);
    ::fasttext::Args::~Args(&local_370);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_450,local_448);
  }
  exit(0);
}

Assistant:

void nn(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printNNUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string prompt("Query word? ");
  std::cout << prompt;
  std::string queryWord;
  while (std::cin >> queryWord) {
//    std::cout << queryWord;
    printPredictions(fasttext.getNNMod(queryWord, k, fasttext.getArgs().factor, fasttext.getArgs().addWo), true, true);
    std::cout << prompt;
  }
  exit(0);
}